

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcomapi.c
# Opt level: O0

void jpeg_abort(j_common_ptr cinfo)

{
  int local_14;
  int pool;
  j_common_ptr cinfo_local;
  
  if (cinfo->mem != (jpeg_memory_mgr *)0x0) {
    for (local_14 = 1; 0 < local_14; local_14 = local_14 + -1) {
      (*cinfo->mem->free_pool)(cinfo,local_14);
    }
    if (cinfo->is_decompressor == 0) {
      cinfo->global_state = 100;
    }
    else {
      cinfo->global_state = 200;
      cinfo[10].err = (jpeg_error_mgr *)0x0;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_abort (j_common_ptr cinfo)
{
  int pool;

  /* Do nothing if called on a not-initialized or destroyed JPEG object. */
  if (cinfo->mem == NULL)
    return;

  /* Releasing pools in reverse order might help avoid fragmentation
   * with some (brain-damaged) malloc libraries.
   */
  for (pool = JPOOL_NUMPOOLS-1; pool > JPOOL_PERMANENT; pool--) {
    (*cinfo->mem->free_pool) (cinfo, pool);
  }

  /* Reset overall state for possible reuse of object */
  if (cinfo->is_decompressor) {
    cinfo->global_state = DSTATE_START;
    /* Try to keep application from accessing now-deleted marker list.
     * A bit kludgy to do it here, but this is the most central place.
     */
    ((j_decompress_ptr) cinfo)->marker_list = NULL;
  } else {
    cinfo->global_state = CSTATE_START;
  }
}